

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

shared_ptr<Type> __thiscall SetElem::check(SetElem *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  int *piVar1;
  SetElem *pSVar2;
  SetElem *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  long lVar5;
  long *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  SetElem *this_01;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  shared_ptr<Type> sVar10;
  
  pSVar2 = (SetElem *)(p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (pSVar2 == (SetElem *)0x0) {
    bVar7 = false;
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p2;
    this_01 = this;
  }
  else {
    this_01 = pSVar2;
    auVar9 = __dynamic_cast(pSVar2,&Type::typeinfo,&Array::typeinfo,0);
    bVar7 = auVar9._0_8_ != 0;
    _Var6._M_pi = auVar9._8_8_;
  }
  pSVar3 = (SetElem *)*in_RCX;
  if (pSVar3 == (SetElem *)0x0) {
    bVar8 = false;
  }
  else {
    this_01 = pSVar3;
    auVar9 = __dynamic_cast(pSVar3,&Type::typeinfo,&Array::typeinfo,0);
    _Var6._M_pi = auVar9._8_8_;
    bVar8 = auVar9._0_8_ != 0;
  }
  if ((bool)(bVar7 | bVar8)) {
LAB_00119832:
    (this->super_Stmt).super_Node._vptr_Node = (_func_int **)0x0;
    *(undefined8 *)&(this->super_Stmt).super_Node.lexline = 0;
  }
  else {
    if (pSVar2 == pSVar3) {
      (this->super_Stmt).super_Node._vptr_Node = (_func_int **)pSVar3;
    }
    else {
      this_00 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      bVar7 = true;
      if ((pSVar2 != (SetElem *)
                     Type::Char.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
         (pSVar2 != (SetElem *)Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )) {
        bVar7 = pSVar2 == (SetElem *)
                          Type::Float.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if (bVar7) {
        peVar4 = (element_type *)*in_RCX;
        this_01 = (SetElem *)in_RCX[1];
        if (this_01 != (SetElem *)0x0) {
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = &(((Word *)&this_01->super_Stmt)->super_Token).tag;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          else {
            piVar1 = &(((Word *)&this_01->super_Stmt)->super_Token).tag;
            *piVar1 = *piVar1 + 1;
          }
        }
        bVar8 = true;
        if ((peVar4 != Type::Char.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
           (peVar4 != Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
          bVar8 = peVar4 == Type::Float.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      }
      else {
        bVar8 = false;
      }
      if (!(bool)(bVar7 ^ 1U | this_01 == (SetElem *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        _Var6._M_pi = extraout_RDX;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var6._M_pi = extraout_RDX_00;
      }
      if (!bVar8) goto LAB_00119832;
      (this->super_Stmt).super_Node._vptr_Node = (_func_int **)*in_RCX;
    }
    *(undefined8 *)&(this->super_Stmt).super_Node.lexline = 0;
    lVar5 = in_RCX[1];
    in_RCX[1] = 0;
    *(long *)&(this->super_Stmt).super_Node.lexline = lVar5;
    *in_RCX = 0;
  }
  sVar10.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar10.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar10.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return p2;
		else if (Type::numeric(p1) && Type::numeric(p2)) return p2;
		else return nullptr;
	}